

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_result_t eVar1;
  void *pvVar2;
  ulong *in_RCX;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  ulong in_R8;
  undefined8 in_R9;
  _internal_exr_part *part_2;
  _internal_exr_context *pctxt_2;
  _internal_exr_part *part_1;
  _internal_exr_context *pctxt_1;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  void *curbuf;
  size_t *in_stack_ffffffffffffffb0;
  _internal_exr_context *p_Var3;
  void **in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  if (in_R8 == 0) {
    p_Var3 = *(_internal_exr_context **)(in_RDI + 0x10);
    if (p_Var3 == (_internal_exr_context *)0x0) {
      return 2;
    }
    if ((-1 < *(int *)(in_RDI + 0xc)) && (*(int *)(in_RDI + 0xc) < p_Var3->num_parts)) {
      eVar1 = (*p_Var3->print_error)
                        (p_Var3,3,"Attempt to allocate 0 byte buffer for transcode buffer %d",
                         (ulong)in_ESI);
      return eVar1;
    }
    if (p_Var3->mode == '\x01') {
      internal_exr_unlock(p_Var3);
    }
    eVar1 = (*p_Var3->print_error)
                      (p_Var3,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
    return eVar1;
  }
  if (((exr_encode_pipeline_t *)*in_RDX == (exr_encode_pipeline_t *)0x0) || (*in_RCX < in_R8)) {
    internal_encode_free_buffer
              ((exr_encode_pipeline_t *)*in_RDX,
               (exr_transcoding_pipeline_buffer_id_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (*(long *)(in_RDI + 0xd8) == 0) {
      p_Var3 = *(_internal_exr_context **)(in_RDI + 0x10);
      if (p_Var3 == (_internal_exr_context *)0x0) {
        return 2;
      }
      if ((*(int *)(in_RDI + 0xc) < 0) || (p_Var3->num_parts <= *(int *)(in_RDI + 0xc))) {
        if (p_Var3->mode == '\x01') {
          internal_exr_unlock(p_Var3);
        }
        eVar1 = (*p_Var3->print_error)
                          (p_Var3,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
        return eVar1;
      }
      pvVar2 = (*p_Var3->alloc_fn)(in_R8);
    }
    else {
      pvVar2 = (void *)(**(code **)(in_RDI + 0xd8))(in_ESI,in_R8);
    }
    if (pvVar2 == (void *)0x0) {
      p_Var3 = *(_internal_exr_context **)(in_RDI + 0x10);
      if (p_Var3 == (_internal_exr_context *)0x0) {
        return 2;
      }
      if ((-1 < *(int *)(in_RDI + 0xc)) && (*(int *)(in_RDI + 0xc) < p_Var3->num_parts)) {
        eVar1 = (*p_Var3->print_error)
                          (p_Var3,1,"Unable to allocate %lu bytes",in_R8,p_Var3->print_error,in_R9,
                           p_Var3->parts[*(int *)(in_RDI + 0xc)]);
        return eVar1;
      }
      if (p_Var3->mode == '\x01') {
        internal_exr_unlock(p_Var3);
      }
      eVar1 = (*p_Var3->print_error)
                        (p_Var3,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
      return eVar1;
    }
    *in_RDX = pvVar2;
    *in_RCX = in_R8;
  }
  return 0;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
            encode->context, encode->part_index);

        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            curbuf = pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                encode->context, encode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}